

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O0

void __thiscall
MT32Emu::Poly::reset(Poly *this,uint newKey,uint newVelocity,bool newSustain,Partial **newPartials)

{
  bool bVar1;
  Synth *this_00;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  Partial **newPartials_local;
  bool newSustain_local;
  uint newVelocity_local;
  uint newKey_local;
  Poly *this_local;
  
  bVar1 = isActive(this);
  if (bVar1) {
    this_00 = Part::getSynth(this->part);
    Synth::printDebug(this_00,"Resetting active poly. Active partial count: %i\n",
                      (ulong)this->activePartialCount);
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if ((this->partials[local_2c] != (Partial *)0x0) &&
         (bVar1 = Partial::isActive(this->partials[local_2c]), bVar1)) {
        Partial::deactivate(this->partials[local_2c]);
        this->activePartialCount = this->activePartialCount - 1;
      }
    }
    setState(this,POLY_Inactive);
  }
  this->key = newKey;
  this->velocity = newVelocity;
  this->sustain = newSustain;
  this->activePartialCount = 0;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    this->partials[local_30] = newPartials[local_30];
    if (newPartials[local_30] != (Partial *)0x0) {
      this->activePartialCount = this->activePartialCount + 1;
      setState(this,POLY_Playing);
    }
  }
  return;
}

Assistant:

void Poly::reset(unsigned int newKey, unsigned int newVelocity, bool newSustain, Partial **newPartials) {
	if (isActive()) {
		// This should never happen
		part->getSynth()->printDebug("Resetting active poly. Active partial count: %i\n", activePartialCount);
		for (int i = 0; i < 4; i++) {
			if (partials[i] != NULL && partials[i]->isActive()) {
				partials[i]->deactivate();
				activePartialCount--;
			}
		}
		setState(POLY_Inactive);
	}

	key = newKey;
	velocity = newVelocity;
	sustain = newSustain;

	activePartialCount = 0;
	for (int i = 0; i < 4; i++) {
		partials[i] = newPartials[i];
		if (newPartials[i] != NULL) {
			activePartialCount++;
			setState(POLY_Playing);
		}
	}
}